

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrLib.c
# Opt level: O3

Rwr_Node_t *
Rwr_ManAddNode(Rwr_Man_t *p,Rwr_Node_t *p0,Rwr_Node_t *p1,int fExor,int Level,int Volume)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  Rwr_Node_t *pNode;
  void **ppvVar4;
  Rwr_Node_t **ppList;
  uint uVar5;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar3 = *(uint *)&p0->field_0xe;
    }
    else {
      uVar3 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 0xe);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar5 = *(uint *)&p1->field_0xe;
    }
    else {
      uVar5 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 0xe);
    }
    uVar5 = uVar5 & uVar3;
  }
  else {
    uVar5 = *(uint *)&p1->field_0xe ^ *(uint *)&p0->field_0xe;
  }
  pNode = (Rwr_Node_t *)Extra_MmFixedEntryFetch(p->pMmNode);
  pNode->Id = p->vForest->nSize;
  pNode->TravId = 0;
  *(uint *)&pNode->field_0xe =
       fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18 | uVar5 & 0xffff;
  pNode->p0 = p0;
  pNode->p1 = p1;
  pNode->pNext = (Rwr_Node_t *)0x0;
  pVVar2 = p->vForest;
  uVar3 = pVVar2->nSize;
  if (uVar3 == pVVar2->nCap) {
    if ((int)uVar3 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar4;
      pVVar2->nCap = 0x10;
    }
    else {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar3 << 4);
      }
      pVVar2->pArray = ppvVar4;
      pVVar2->nCap = uVar3 * 2;
    }
  }
  else {
    ppvVar4 = pVVar2->pArray;
  }
  iVar1 = pVVar2->nSize;
  pVVar2->nSize = iVar1 + 1;
  ppvVar4[iVar1] = pNode;
  ppList = (Rwr_Node_t **)(ulong)(uVar5 & 0xffff);
  if (p->puCanons[(long)ppList] == (unsigned_short)uVar5) {
    p->nAdded = p->nAdded + 1;
    if (p->pTable[(long)ppList] == (Rwr_Node_t *)0x0) {
      p->nClasses = p->nClasses + 1;
    }
    Rwr_ListAddToTail(ppList,pNode);
  }
  return pNode;
}

Assistant:

Rwr_Node_t * Rwr_ManAddNode( Rwr_Man_t * p, Rwr_Node_t * p0, Rwr_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwr_Node_t * pNew;
    unsigned uTruth;
    // compute truth table, leve, volume
    p->nConsidered++;
    if ( fExor )
        uTruth = (p0->uTruth ^ p1->uTruth);
    else
        uTruth = (Rwr_IsComplement(p0)? ~Rwr_Regular(p0)->uTruth : Rwr_Regular(p0)->uTruth) & 
                 (Rwr_IsComplement(p1)? ~Rwr_Regular(p1)->uTruth : Rwr_Regular(p1)->uTruth) & 0xFFFF;
    // create the new node
    pNew = (Rwr_Node_t *)Extra_MmFixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    // do not add if the node is not essential
    if ( uTruth != p->puCanons[uTruth] )
        return pNew;

    // add to the list
    p->nAdded++;
    if ( p->pTable[uTruth] == NULL )
        p->nClasses++;
    Rwr_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}